

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_andnot(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint32_t cap;
  uint16_t *puVar1;
  uint16_t *puVar2;
  int iVar3;
  roaring_array_t *prVar4;
  int *c;
  roaring_bitmap_t *prVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  int *piVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uint8_t uVar15;
  uint uVar16;
  ushort uVar17;
  ushort uVar18;
  uint32_t start_index;
  ulong uVar19;
  uint8_t result_type;
  uint8_t local_45;
  uint local_44;
  roaring_array_t *local_40;
  ulong local_38;
  
  local_45 = '\0';
  cap = (x1->high_low_container).size;
  if (cap == 0) {
    local_40 = &roaring_bitmap_create_with_capacity(0)->high_low_container;
    bVar9 = 1;
    if (((x1->high_low_container).flags & 1) == 0) {
      bVar9 = (x2->high_low_container).flags & 1;
    }
    local_40->flags = local_40->flags & 0xfe | bVar9;
  }
  else {
    local_44 = (x2->high_low_container).size;
    if (local_44 == 0) {
      prVar5 = roaring_bitmap_copy(x1);
      return prVar5;
    }
    local_40 = &roaring_bitmap_create_with_capacity(cap)->high_low_container;
    bVar9 = 1;
    if (((x1->high_low_container).flags & 1) == 0) {
      bVar9 = (x2->high_low_container).flags & 1;
    }
    local_40->flags = local_40->flags & 0xfe | bVar9;
    uVar8 = 0;
    uVar19 = 0;
LAB_00106c5b:
    do {
      uVar12 = uVar8 & 0xffff;
      local_38 = uVar8;
      while( true ) {
        puVar1 = (x1->high_low_container).keys;
        uVar8 = uVar19 & 0xffff;
        uVar18 = puVar1[uVar8];
        puVar2 = (x2->high_low_container).keys;
        uVar17 = puVar2[uVar12];
        start_index = (uint32_t)uVar19;
        if (uVar18 == uVar17) break;
        if (uVar17 <= uVar18) {
          uVar11 = (x2->high_low_container).size;
          uVar16 = (int)local_38 + 1;
          uVar6 = uVar16;
          if (((int)uVar11 <= (int)uVar16) || (uVar18 <= puVar2[(int)uVar16])) goto LAB_00106e1e;
          uVar6 = (int)local_38 + 2;
          iVar13 = 1;
          if ((int)uVar11 <= (int)uVar6) goto LAB_00106e03;
          iVar13 = 1;
          goto LAB_00106de6;
        }
        uVar11 = (x1->high_low_container).size;
        uVar16 = start_index + 1;
        uVar6 = uVar16;
        if (((int)uVar16 < (int)uVar11) && (puVar1[(int)uVar16] < uVar17)) {
          uVar6 = start_index + 2;
          iVar13 = 1;
          if ((int)uVar6 < (int)uVar11) {
            iVar13 = 1;
            do {
              uVar8 = (ulong)uVar6;
              uVar18 = puVar1[(int)uVar6];
              if (uVar17 <= uVar18) goto LAB_00106ce1;
              iVar3 = iVar13 * 2;
              uVar6 = uVar16 + iVar13 * 2;
              iVar13 = iVar3;
            } while ((int)uVar6 < (int)uVar11);
          }
          uVar18 = puVar1[(long)(int)uVar11 + -1];
          uVar8 = (long)(int)uVar11 - 1;
LAB_00106ce1:
          uVar7 = (uint)uVar8;
          uVar6 = uVar7;
          if (((uVar18 != uVar17) && (uVar6 = uVar11, uVar17 <= uVar18)) &&
             (uVar6 = uVar7, (iVar13 >> 1) + uVar16 + 1 != uVar7)) {
            uVar16 = (iVar13 >> 1) + uVar16;
            do {
              uVar6 = (int)(uVar16 + (uint)uVar8) >> 1;
              if (puVar1[(int)uVar6] == uVar17) break;
              uVar11 = uVar6;
              if (puVar1[(int)uVar6] < uVar17) {
                uVar11 = (uint)uVar8;
                uVar16 = uVar6;
              }
              uVar8 = (ulong)uVar11;
              uVar6 = uVar11;
            } while (uVar16 + 1 != uVar11);
          }
        }
        ra_append_copy_range
                  (local_40,&x1->high_low_container,start_index,uVar6,
                   (_Bool)((x1->high_low_container).flags & 1));
        uVar19 = (ulong)uVar6;
        if (uVar6 == cap) {
          uVar11 = (uint)local_38;
          start_index = cap;
          goto LAB_00106ef0;
        }
      }
      c = (int *)container_andnot((x1->high_low_container).containers[uVar8],
                                  (x1->high_low_container).typecodes[uVar8],
                                  (x2->high_low_container).containers[uVar12],
                                  (x2->high_low_container).typecodes[uVar12],&local_45);
      uVar8 = local_38;
      piVar10 = c;
      uVar15 = local_45;
      if (local_45 == '\x04') {
        uVar15 = (uint8_t)c[2];
        piVar10 = *(int **)c;
      }
      iVar13 = *piVar10;
      if ((uVar15 == '\x03') || (uVar15 == '\x02')) {
        if (iVar13 < 1) goto LAB_00106e51;
LAB_00106e5e:
        ra_append(local_40,uVar18,c,local_45);
      }
      else {
        if (iVar13 != 0) {
          if (iVar13 != -1) goto LAB_00106e5e;
          lVar14 = 0;
          do {
            if (*(long *)(*(long *)(piVar10 + 2) + lVar14 * 8) != 0) goto LAB_00106e5e;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x400);
        }
LAB_00106e51:
        container_free(c,local_45);
      }
      start_index = start_index + 1;
      uVar19 = (ulong)start_index;
      uVar11 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar11;
    } while ((start_index != cap) && (uVar11 != local_44));
LAB_00106ef0:
    if (uVar11 == local_44) {
LAB_00106ef6:
      prVar4 = local_40;
      ra_append_copy_range
                (local_40,&x1->high_low_container,start_index,cap,
                 (_Bool)((x1->high_low_container).flags & 1));
      local_40 = prVar4;
    }
  }
  return (roaring_bitmap_t *)local_40;
  while( true ) {
    iVar3 = iVar13 * 2;
    uVar6 = uVar16 + iVar13 * 2;
    iVar13 = iVar3;
    if ((int)uVar11 <= (int)uVar6) break;
LAB_00106de6:
    uVar8 = (ulong)uVar6;
    uVar17 = puVar2[(int)uVar6];
    if (uVar18 <= uVar17) goto LAB_00106e11;
  }
LAB_00106e03:
  uVar17 = puVar2[(long)(int)uVar11 + -1];
  uVar8 = (long)(int)uVar11 - 1;
LAB_00106e11:
  uVar7 = (uint)uVar8;
  uVar6 = uVar7;
  if (((uVar17 != uVar18) && (uVar6 = uVar11, uVar18 <= uVar17)) &&
     (uVar6 = uVar7, (iVar13 >> 1) + uVar16 + 1 != uVar7)) {
    uVar16 = (iVar13 >> 1) + uVar16;
    do {
      uVar6 = (int)(uVar16 + (uint)uVar8) >> 1;
      if (puVar2[(int)uVar6] == uVar18) break;
      uVar11 = uVar6;
      if (puVar2[(int)uVar6] < uVar18) {
        uVar11 = (uint)uVar8;
        uVar16 = uVar6;
      }
      uVar8 = (ulong)uVar11;
      uVar6 = uVar11;
    } while (uVar16 + 1 != uVar11);
  }
LAB_00106e1e:
  uVar8 = (ulong)uVar6;
  if (uVar6 == local_44) goto LAB_00106ef6;
  goto LAB_00106c5b;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_andnot(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        roaring_bitmap_t *empty_bitmap = roaring_bitmap_create();
        roaring_bitmap_set_copy_on_write(empty_bitmap,
                                         is_cow(x1) || is_cow(x2));
        return empty_bitmap;
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(length1);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = 0;
    uint16_t s2 = 0;
    while (true) {
        s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c =
                container_andnot(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
        } else if (s1 < s2) {  // s1 < s2
            const int next_pos1 =
                ra_advance_until(&x1->high_low_container, s2, pos1);
            ra_append_copy_range(&answer->high_low_container,
                                 &x1->high_low_container, pos1, next_pos1,
                                 is_cow(x1));
            // TODO : perhaps some of the copy_on_write should be based on
            // answer rather than x1 (more stringent?).  Many similar cases
            pos1 = next_pos1;
            if (pos1 == length1) break;
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
        }
    }
    if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}